

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Analyze
          (StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *this,
          ColumnWriterState *state_p,ColumnWriterState *parent,Vector *vector,idx_t count)

{
  bool bVar1;
  StandardColumnWriterState<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *pSVar2;
  float_na_equal *pfVar3;
  size_type sVar4;
  ValidityMask *this_00;
  idx_t iVar5;
  long in_RDX;
  ulong in_R8;
  float_na_equal *src_value_1;
  idx_t i;
  float_na_equal *src_value;
  ValidityMask *validity;
  idx_t vcount;
  idx_t parent_index;
  bool check_parent_empty;
  idx_t vector_index;
  float_na_equal *data_ptr;
  StandardColumnWriterState<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *state;
  size_type in_stack_ffffffffffffff48;
  uint7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
  *in_stack_ffffffffffffff58;
  ulong uVar6;
  byte local_95;
  reference local_88;
  ulong local_78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ulong local_40;
  
  pSVar2 = ColumnWriterState::
           Cast<duckdb::StandardColumnWriterState<duckdb::float_na_equal,float,duckdb::FloatingPointOperator>>
                     ((ColumnWriterState *)
                      CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  pfVar3 = FlatVector::GetData<duckdb::float_na_equal>((Vector *)0x5f9461);
  local_40 = 0;
  local_95 = 0;
  if (in_RDX != 0) {
    bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_95 = bVar1 ^ 0xff;
  }
  local_95 = local_95 & 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
            (&(pSVar2->super_PrimitiveColumnWriterState).super_ColumnWriterState.definition_levels.
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>);
  if (local_95 != 0) {
    in_stack_ffffffffffffff58 =
         (PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDX + 8));
    sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      (&(pSVar2->super_PrimitiveColumnWriterState).super_ColumnWriterState.
                        definition_levels.
                        super_vector<unsigned_short,_std::allocator<unsigned_short>_>);
    in_R8 = (long)in_stack_ffffffffffffff58 - sVar4;
  }
  uVar6 = in_R8;
  this_00 = FlatVector::Validity((Vector *)0x5f951e);
  if ((local_95 == 0) &&
     (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                        ((TemplatedValidityMask<unsigned_long> *)this_00), bVar1)) {
    for (; local_40 < in_R8; local_40 = local_40 + 1) {
      PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Insert
                (in_stack_ffffffffffffff58,SUB81(uVar6 >> 0x20,0));
      pSVar2->total_value_count = pSVar2->total_value_count + 1;
      iVar5 = DlbaEncoder::GetStringSize<duckdb::float_na_equal>(pfVar3 + local_40 * 4);
      pSVar2->total_string_size = iVar5 + pSVar2->total_string_size;
    }
  }
  else {
    for (local_78 = 0; local_78 < in_R8; local_78 = local_78 + 1) {
      bVar1 = false;
      if (local_95 != 0) {
        local_88 = vector<bool,_true>::operator[]
                             ((vector<bool,_true> *)(ulong)in_stack_ffffffffffffff50,
                              in_stack_ffffffffffffff48);
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_88);
      }
      if (bVar1 == false) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff58,
                           (ulong)in_stack_ffffffffffffff50);
        if (bVar1) {
          PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Insert
                    (in_stack_ffffffffffffff58,SUB81(uVar6 >> 0x20,0));
          pSVar2->total_value_count = pSVar2->total_value_count + 1;
          iVar5 = DlbaEncoder::GetStringSize<duckdb::float_na_equal>(pfVar3 + local_40 * 4);
          pSVar2->total_string_size = iVar5 + pSVar2->total_string_size;
        }
        local_40 = local_40 + 1;
      }
    }
  }
  return;
}

Assistant:

void Analyze(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();

		auto data_ptr = FlatVector::GetData<SRC>(vector);
		idx_t vector_index = 0;

		const bool check_parent_empty = parent && !parent->is_empty.empty();
		const idx_t parent_index = state.definition_levels.size();

		const idx_t vcount =
		    check_parent_empty ? parent->definition_levels.size() - state.definition_levels.size() : count;

		const auto &validity = FlatVector::Validity(vector);

		if (!check_parent_empty && validity.AllValid()) {
			// Fast path
			for (; vector_index < vcount; vector_index++) {
				const auto &src_value = data_ptr[vector_index];
				state.dictionary.Insert(src_value);
				state.total_value_count++;
				state.total_string_size += DlbaEncoder::GetStringSize(src_value);
			}
		} else {
			for (idx_t i = 0; i < vcount; i++) {
				if (check_parent_empty && parent->is_empty[parent_index + i]) {
					continue;
				}
				if (validity.RowIsValid(vector_index)) {
					const auto &src_value = data_ptr[vector_index];
					state.dictionary.Insert(src_value);
					state.total_value_count++;
					state.total_string_size += DlbaEncoder::GetStringSize(src_value);
				}
				vector_index++;
			}
		}
	}